

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall section_data::calibrate_axes(section_data *this,int xx1,int yy1,int xx2,int yy2)

{
  int iVar1;
  ostream *poVar2;
  double dVar3;
  int holder;
  int yy2_local;
  int xx2_local;
  int yy1_local;
  int xx1_local;
  section_data *this_local;
  
  this->x1 = xx1;
  this->y1 = yy1;
  this->x2 = xx2;
  this->y2 = yy2;
  dVar3 = sqrt(((double)this->x2 - (double)this->x1) * ((double)this->x2 - (double)this->x1) +
               ((double)this->y2 - (double)this->y1) * ((double)this->y2 - (double)this->y1));
  dVar3 = round(dVar3);
  this->xsec_distance = (int)dVar3;
  if ((this->x1 == this->x2) && (this->y1 == this->y2)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Slicing between [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x1);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y1);
    poVar2 = std::operator<<(poVar2,"] and [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x2);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y2);
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Error: Cannot slice on a single point.");
    this_local._4_4_ = 1;
  }
  else if (this->y1 == this->y2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Horizontal cross-section");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->axis_type = 1;
    if (this->x2 < this->x1) {
      iVar1 = this->x2;
      this->x2 = this->x1;
      this->x1 = iVar1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Slicing between [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x1);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y1);
    poVar2 = std::operator<<(poVar2,"] and [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x2);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y2);
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else if (this->x1 == this->x2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Vertical cross-section");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->axis_type = 3;
    if (this->y2 < this->y1) {
      iVar1 = this->y2;
      this->y2 = this->y1;
      this->y1 = iVar1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Slicing between [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x1);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y1);
    poVar2 = std::operator<<(poVar2,"] and [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x2);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y2);
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else if ((this->x1 == this->x2) || (this->y1 == this->y2)) {
    this_local._4_4_ = 1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Diagonal cross-section");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->axis_type = 2;
    if (this->x2 < this->x1) {
      iVar1 = this->x2;
      this->x2 = this->x1;
      this->x1 = iVar1;
      iVar1 = this->y2;
      this->y2 = this->y1;
      this->y1 = iVar1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Slicing between [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x1);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y1);
    poVar2 = std::operator<<(poVar2,"] and [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x2);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y2);
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int section_data::calibrate_axes(int xx1, int yy1, int xx2, int yy2)
{
  x1 = xx1;
  y1 = yy1;
  x2 = xx2;
  y2 = yy2;
  xsec_distance =
      (int)round(sqrt(((double)x2 - (double)x1) * ((double)x2 - (double)x1) +
                      ((double)y2 - (double)y1) * ((double)y2 - (double)y1)));
  int holder;

  if ((x1 == x2) && (y1 == y2)) // Single point
  {
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    cout << "Error: Cannot slice on a single point.";
    return EXIT_FAILURE;
  } else if (y1 == y2) // Horizontal cross-section
  {
    cout << "Horizontal cross-section" << endl;
    axis_type = 1;
    if (x1 > x2) // Ensure x1 is always LE to x2
    {
      holder = x2;
      x2 = x1;
      x1 = holder;
    }
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    return EXIT_SUCCESS;
  } else if (x1 == x2) // Vertical cross-section
  {
    cout << "Vertical cross-section" << endl;
    axis_type = 3;
    if (y1 > y2) // Ensure y1 is always LE to y2
    {
      holder = y2;
      y2 = y1;
      y1 = holder;
    }
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    return EXIT_SUCCESS;
  } else if ((x1 != x2) && (y1 != y2)) {
    cout << "Diagonal cross-section" << endl;
    axis_type = 2;
    if (x1 > x2) // Ensure x1 is always LE to x2
    {
      holder = x2;
      x2 = x1;
      x1 = holder;
      holder = y2;
      y2 = y1;
      y1 = holder;
    }
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    return EXIT_SUCCESS;
  }
  return EXIT_FAILURE;
}